

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

void oonf_layer2_neigh_relabel
               (oonf_layer2_neigh *l2neigh,oonf_layer2_origin *new_origin,
               oonf_layer2_origin *old_origin)

{
  list_entity *plVar1;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t i;
  oonf_layer2_destination *l2dst;
  oonf_layer2_neighbor_address *neigh_ip;
  oonf_layer2_origin *old_origin_local;
  oonf_layer2_origin *new_origin_local;
  oonf_layer2_neigh *l2neigh_local;
  
  for (__tempptr = (list_entity *)0x0; __tempptr < (list_entity *)0x1a;
      __tempptr = (list_entity *)((long)&__tempptr->next + 1)) {
    if (l2neigh->data[(long)__tempptr]._origin == old_origin) {
      l2neigh->data[(long)__tempptr]._origin = new_origin;
    }
  }
  plVar1 = (l2neigh->remote_neighbor_ips).list_head.next;
  while( true ) {
    if (plVar1->prev == (l2neigh->remote_neighbor_ips).list_head.prev) break;
    if ((oonf_layer2_origin *)plVar1[-4].next == old_origin) {
      plVar1[-4].next = (list_entity *)new_origin;
    }
    plVar1 = plVar1->next;
  }
  plVar1 = (l2neigh->destinations).list_head.next;
  while( true ) {
    if (plVar1->prev == (l2neigh->destinations).list_head.prev) break;
    if ((oonf_layer2_origin *)plVar1[-1].prev == old_origin) {
      plVar1[-1].prev = (list_entity *)new_origin;
    }
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
oonf_layer2_neigh_relabel(struct oonf_layer2_neigh *l2neigh, const struct oonf_layer2_origin *new_origin,
  const struct oonf_layer2_origin *old_origin) {
  struct oonf_layer2_neighbor_address *neigh_ip;
  struct oonf_layer2_destination *l2dst;
  size_t i;

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_get_origin(&l2neigh->data[i]) == old_origin) {
      oonf_layer2_data_set_origin(&l2neigh->data[i], new_origin);
    }
  }

  avl_for_each_element(&l2neigh->remote_neighbor_ips, neigh_ip, _neigh_node) {
    if (neigh_ip->origin == old_origin) {
      neigh_ip->origin = new_origin;
    }
  }

  avl_for_each_element(&l2neigh->destinations, l2dst, _node) {
    if (l2dst->origin == old_origin) {
      l2dst->origin = new_origin;
    }
  }
}